

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

int one_hit_new(CHAR_DATA *ch,CHAR_DATA *victim,int dt,bool specials,bool blockable,int addition,
               int multiplier,char *dnoun)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  CClass *pCVar6;
  AFFECT_DATA *pAVar7;
  OBJ_AFFECT_DATA *pOVar8;
  int iVar9;
  short *psVar10;
  OBJ_DATA *pOVar11;
  short sVar12;
  float local_c4;
  float local_c0;
  int local_bc;
  OBJ_DATA *local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  ulong local_a0;
  AFFECT_DATA af;
  
  if (victim == (CHAR_DATA *)0x0) {
    return 0;
  }
  if (ch == (CHAR_DATA *)0x0) {
    return 0;
  }
  if (victim == ch) {
    return 0;
  }
  if (victim->position == 0) {
    return 0;
  }
  if ((ch->in_room != victim->in_room) && (gsn_hurl != dt)) {
    return 0;
  }
  local_bc = dt;
  bVar1 = is_safe(ch,victim);
  if (bVar1) {
    return 0;
  }
  iVar3 = dt;
  if (dt == -3) {
    local_bc = -1;
    iVar3 = -1;
  }
  local_b8 = get_eq_char(ch,0x10);
  iVar9 = (int)gsn_dual_wield;
  if (iVar3 == iVar9) {
    local_b8 = get_eq_char(ch,0x12);
    iVar9 = (int)gsn_dual_wield;
  }
  if ((iVar3 == -1) || (iVar3 == iVar9)) {
    if ((local_b8 == (OBJ_DATA *)0x0) || (local_b8->item_type != 5)) {
      iVar3 = ch->dam_type + 1000;
      local_bc = iVar3;
      goto LAB_002e866d;
    }
    iVar4 = local_b8->value[3];
    iVar3 = iVar4 + 1000;
    local_bc = iVar3;
LAB_002e8678:
    lVar5 = (long)iVar4;
    local_ac = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
  }
  else {
LAB_002e866d:
    if (local_b8 != (OBJ_DATA *)0x0) {
      iVar4 = local_b8->value[3];
      goto LAB_002e8678;
    }
    lVar5 = (long)ch->dam_type;
    local_ac = 0;
  }
  local_a8 = 1;
  if (attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5].damage != -1) {
    local_a8 = attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5].damage;
  }
  local_a4 = iVar3;
  local_a0 = (ulong)(uint)addition;
  iVar9 = get_weapon_sn_new(ch,iVar3);
  iVar3 = get_weapon_skill(ch,iVar9);
  if (dt == -3) {
    local_a8 = 0x13;
  }
  iVar3 = iVar3 + 0x14;
  bVar1 = is_npc(ch);
  if (local_b8 == (OBJ_DATA *)0x0 && bVar1) {
    iVar9 = dice((int)ch->damage[0],(int)ch->damage[1]);
  }
  else {
    if (iVar9 != -1) {
      check_improve(ch,iVar9,true,5);
    }
    pOVar11 = local_b8;
    if ((byte)local_ac != '\0') {
      iVar9 = dice(local_b8->value[1],local_b8->value[2]);
      local_c4 = (float)((iVar9 * iVar3) / 100);
      iVar9 = (int)pOVar11->level - (int)ch->level;
      if (iVar9 < 0x23) {
        if (0x18 < iVar9) {
          local_c4 = local_c4 * 7.0;
          goto LAB_002e8de9;
        }
        if (0xe < iVar9) {
          local_c4 = local_c4 * 8.0;
          goto LAB_002e8de9;
        }
        if (4 < iVar9) {
          local_c4 = local_c4 * 9.0;
          goto LAB_002e8de9;
        }
      }
      else {
        local_c4 = local_c4 * 6.0;
LAB_002e8de9:
        local_c4 = local_c4 / 10.0;
        local_c0 = local_c4;
      }
      bVar1 = is_weapon_stat(pOVar11,3);
      if ((bVar1) && (iVar9 = number_percent(), iVar9 <= iVar3 / 8)) {
        local_c4 = local_c4 * 1.2;
      }
      goto LAB_002e87ae;
    }
    iVar9 = number_range(iVar3 / 0x19 + 1,(((ch->level * 2) / 3) * iVar3) / 100);
  }
  local_c4 = (float)iVar9;
LAB_002e87ae:
  iVar9 = get_skill(ch,(int)gsn_enhanced_damage);
  if (iVar9 < 1) {
    local_c4 = local_c4 * 0.7;
    local_c0 = local_c4;
  }
  else {
    iVar9 = number_percent();
    iVar4 = get_skill(ch,(int)gsn_enhanced_damage);
    if (iVar9 <= iVar4) {
      check_improve(ch,(int)gsn_enhanced_damage,true,6);
      iVar9 = number_percent();
      local_c4 = local_c4 * (float)(iVar9 / 200 + 3) * 0.5;
    }
    pCVar6 = char_data::Class(ch);
    bVar1 = RString::operator==(&pCVar6->name,"thief");
    if (bVar1) {
      local_c4 = local_c4 * 0.75;
    }
    iVar9 = get_skill(ch,(int)gsn_brutality);
    if ((0 < iVar9) && (bVar1 = is_npc(ch), !bVar1)) {
      iVar9 = number_percent();
      iVar4 = get_skill(ch,(int)gsn_brutality);
      if (iVar9 < iVar4) {
        bVar1 = style_check((int)gsn_brutality,(int)ch->pcdata->style);
        if (((bVar1 & (byte)local_ac) == 1) && (0xe < local_b8->weight)) {
          check_improve(ch,(int)gsn_brutality,true,5);
          local_c4 = local_c4 * 5.0 * 0.25;
          local_c0 = local_c4;
        }
      }
    }
  }
  pAVar7 = affect_find(ch->affected,(int)gsn_hardenfist);
  pOVar11 = local_b8;
  if (((local_b8 == (OBJ_DATA *)0x0) &&
      (bVar1 = is_affected(ch,(int)gsn_hardenfist), pOVar11 = local_b8, pAVar7 != (AFFECT_DATA *)0x0
      )) && (bVar1)) {
    iVar9 = dice((int)(pAVar7->level / 4),4);
    local_c4 = (float)(((iVar9 + 10) * iVar3) / 100);
  }
  sVar2 = get_damroll(ch);
  if (99 < iVar3) {
    iVar3 = 100;
  }
  local_c4 = (float)((iVar3 * sVar2) / 100) + local_c4;
  local_c0 = local_c4;
  bVar1 = is_npc(ch);
  if (!bVar1) {
    local_c4 = local_c4 * pc_race_table[ch->race].racialDam;
    local_c0 = local_c4;
  }
  bVar1 = is_npc(ch);
  if (((!bVar1) && (bVar1 = is_affected(ch,(int)gsn_rage), bVar1)) &&
     ((ch->pcdata->tribe == 1 && (iVar3 = number_percent(), iVar3 < 10)))) {
    send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r",ch);
    act("$n gets an enraged look in $s eyes and delivers a mighty blow!",ch,(void *)0x0,(void *)0x0,
        0);
    local_c4 = local_c4 * (float)(int)(ch->level / 0x14);
    local_c0 = local_c4;
  }
  if (local_c4 <= 0.0) {
    local_c0 = 1.0;
  }
  bVar1 = is_npc(ch);
  iVar3 = local_a4;
  if (((pOVar11 == (OBJ_DATA *)0x0) && (!bVar1)) &&
     ((999 < local_a4 || (local_a4 == gsn_dual_wield)))) {
    local_bc = 0x3f9;
    iVar3 = 0x3f9;
  }
  if ((byte)local_ac != '\0') {
    pCVar6 = char_data::Class(ch);
    iVar9 = CClass::GetIndex(pCVar6);
    pOVar11 = local_b8;
    if ((((iVar9 == 4) && (ch->fighting != (CHAR_DATA *)0x0)) && (999 < iVar3)) &&
       (iVar3 = check_arms(ch,local_b8,false), 0 < iVar3)) {
      local_bc = iVar3 + 1000;
    }
    if ((((pOVar11->pIndexData->spec_prog).trapvector & 0x2000) != 0) &&
       (iVar3 = (*(pOVar11->pIndexData->spec_prog).func)
                          (0x2000,ch,victim,local_b8,&local_c0,&local_bc,&local_a8), 0 < iVar3)) {
      return 0;
    }
  }
  bVar1 = is_npc(victim);
  if (((bVar1) && ((victim->act[0] & 1) != 0)) &&
     ((((victim->pIndexData->spec_prog).trapvector & 0x2000) != 0 &&
      (iVar3 = (*(victim->pIndexData->spec_prog).func)
                         (0x2000,ch,victim,local_b8,&local_c0,&local_bc,&local_a8), 0 < iVar3)))) {
    return 0;
  }
  iVar9 = damage_new(ch,victim,(int)local_c0,local_bc,local_a8,true,blockable,(int)local_a0,
                     multiplier,dnoun);
  iVar3 = iVar9;
  if ((char)local_ac == '\x01' && iVar9 != -1) {
    if ((local_b8->progtypes[0] & 0x40000) != 0) {
      (*local_b8->pIndexData->iprogs->hit_prog)(local_b8,ch,victim,iVar9);
    }
    pOVar11 = local_b8;
    iVar3 = 0;
    if (((iVar9 != 0) && (iVar3 = iVar9, ch->fighting == victim)) &&
       (bVar1 = is_weapon_stat(local_b8,7), bVar1)) {
      pOVar8 = affect_find_obj(pOVar11->affected,(int)gsn_poison);
      psVar10 = &pOVar8->level;
      if (pOVar8 == (OBJ_AFFECT_DATA *)0x0) {
        psVar10 = &pOVar11->level;
      }
      sVar2 = *psVar10;
      bVar1 = saves_spell((int)(sVar2 / 2),victim,8);
      if ((!bVar1) && (bVar1 = is_affected_by(victim,0xc), !bVar1)) {
        send_to_char("You feel poison coursing through your veins.\n\r",victim);
        act("$n is poisoned by the venom on $p.",victim,local_b8,(void *)0x0,0);
        init_affect(&af);
        af.where = 0;
        af.aftype = 0;
        af.type = gsn_poison;
        af.level = (short)((sVar2 * 3) / 4);
        af.duration = sVar2 / 10;
        af.location = 1;
        af.modifier = -3;
        af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 0x10;
        affect_join(victim,&af);
      }
      if (pOVar8 != (OBJ_AFFECT_DATA *)0x0) {
        sVar2 = 2;
        if (2 < pOVar8->level) {
          sVar2 = pOVar8->level;
        }
        sVar12 = 1;
        if (1 < pOVar8->duration) {
          sVar12 = pOVar8->duration;
        }
        pOVar8->level = sVar2 + -2;
        pOVar8->duration = sVar12 + -1;
        if ((short)(sVar12 + -1) == 0 || (short)(sVar2 + -2) == 0) {
          act("The poison on $p has worn off.",ch,local_b8,(void *)0x0,3);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int one_hit_new(CHAR_DATA *ch, CHAR_DATA *victim, int dt, bool specials, bool blockable, int addition, int multiplier, char *dnoun)
{
	OBJ_DATA *wield = nullptr, *dualw = nullptr;
	AFFECT_DATA *af;
	int mdam, diceroll, diceroll2 = 0, sn, skill, dam_type, tmp_dt, result, rdt;
	float dam;
	bool truestrike = false;

	if (victim == ch
		|| ch == nullptr
		|| victim == nullptr
		|| victim->position == POS_DEAD
		|| (ch->in_room != victim->in_room && dt != gsn_hurl) || is_safe(ch, victim))
	{
		return 0;
	}

	if (dt == TYPE_TRUESTRIKE)
	{
		truestrike = true;
		dt = TYPE_UNDEFINED;
	}

	wield = get_eq_char(ch, WEAR_WIELD);

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);

	if (dt == TYPE_UNDEFINED || dt == gsn_dual_wield)
	{
		dt = TYPE_HIT;

		if (wield != nullptr && wield->item_type == ITEM_WEAPON)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (wield != nullptr)
		dam_type = attack_table[wield->value[3]].damage;
	else
		dam_type = attack_table[ch->dam_type].damage;

	if (dam_type == -1)
		dam_type = DAM_BASH;

	sn = get_weapon_sn_new(ch, dt);
	skill = 20 + get_weapon_skill(ch, sn);

	if (truestrike)
		dam_type = DAM_TRUESTRIKE;

	if (is_npc(ch) && wield == nullptr)
	{
		dam = dice(ch->damage[DICE_NUMBER], ch->damage[DICE_TYPE]);
	}
	else
	{
		if (sn != -1)
			check_improve(ch, sn, true, 5);

		if (wield != nullptr)
		{
			dam = dice(wield->value[1], wield->value[2]) * skill / 100;

			if (wield->level - ch->level >= 35)
				dam = (dam * 6) / 10;
			else if (wield->level - ch->level >= 25)
				dam = (dam * 7) / 10;
			else if (wield->level - ch->level >= 15)
				dam = (dam * 8) / 10;
			else if (wield->level - ch->level >= 5)
				dam = (dam * 9) / 10;

			if (is_weapon_stat(wield, WEAPON_SHARP))
			{
				if (number_percent() <= (skill / 8))
					dam *= 1.2;
			}
		}
		else
		{
			dam = number_range(1 + 4 * skill / 100, 2 * ch->level / 3 * skill / 100);
		}
	}

	if (get_skill(ch, gsn_enhanced_damage) > 0)
	{
		if (number_percent() <= get_skill(ch, gsn_enhanced_damage))
		{
			check_improve(ch, gsn_enhanced_damage, true, 6);
			dam *= 3 + (number_percent() / 200);
			dam /= 2;
		}

		if (ch->Class()->name == "thief")
			dam *= 0.75;

		if (get_skill(ch, gsn_brutality) > 0
			&& !is_npc(ch)
			&& number_percent() < get_skill(ch, gsn_brutality)
			&& style_check(gsn_brutality, ch->pcdata->style)
			&& (wield != nullptr && wield->weight >= 15))
		{
			check_improve(ch, gsn_brutality, true, 5);
			dam *= 5;
			dam /= 4;
		}
	}
	else
	{
		dam *= (float).7;
	}

	af = affect_find(ch->affected, gsn_hardenfist);

	if (wield == nullptr && is_affected(ch, gsn_hardenfist) && af)
		dam = (dice((af->level / 4), 4) + 10) * skill / 100;

	mdam = get_damroll(ch);
	dam += mdam * std::min(100, skill) / 100;

	if (!is_npc(ch))
		dam *= pc_race_table[ch->race].racialDam;

	if (!is_npc(ch) && is_affected(ch, gsn_rage) && ch->pcdata->tribe == TRIBE_BOAR && number_percent() < 10)
	{
		send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r", ch);
		act("$n gets an enraged look in $s eyes and delivers a mighty blow!", ch, 0, 0, TO_ROOM);
		dam *= ch->level / 20;
	}

	if (dam <= 0)
		dam = 1;

	if (!is_npc(ch) && wield == nullptr && (dt >= TYPE_HIT || dt == gsn_dual_wield))
		dt = TYPE_HIT + 17; // hth = #17

	if (wield
		&& ch->Class()->GetIndex() == CLASS_PALADIN
		&& ch->fighting
		&& dt >= TYPE_HIT
		&& (rdt = check_arms(ch, wield, false)) > 0) // check_arms returns 0 if normal
	{
		dt = rdt + TYPE_HIT;
	}

	if (wield && TRAPS_IEVENT(wield, TRAP_IONEHIT))
	{
		if (CALL_IEVENT(wield, TRAP_IONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	// mob onehit [mhit] fires when mob is hit, but item onehit fires when item does the hitting

	if (is_npc(victim) && TRAPS_MEVENT(victim, TRAP_MONEHIT))
	{
		if (CALL_IEVENT(victim, TRAP_MONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	result = damage_new(ch, victim, (int)dam, dt, dam_type, true, blockable, addition, multiplier, dnoun);

	if (result == -1) // death
		return -1;

	if (wield && IS_SET(wield->progtypes, IPROG_HIT))
		(wield->pIndexData->iprogs->hit_prog)(wield, ch, victim, result);

	if (result && wield != nullptr)
	{
		if (ch->fighting == victim && is_weapon_stat(wield, WEAPON_POISON))
		{
			int level = 10;
			OBJ_AFFECT_DATA *poison;
			AFFECT_DATA af;

			poison = affect_find_obj(wield->affected, gsn_poison);

			if (poison == nullptr)
				level = wield->level;
			else
				level = poison->level;

			if (!saves_spell(level / 2, victim, DAM_POISON) && !is_affected_by(victim, AFF_POISON))
			{
				send_to_char("You feel poison coursing through your veins.\n\r", victim);
				act("$n is poisoned by the venom on $p.", victim, wield, nullptr, TO_ROOM);
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.aftype = AFT_SPELL;
				af.type = gsn_poison;
				af.level = level * 3 / 4;
				af.duration = level / 10;
				af.location = APPLY_STR;
				af.modifier = -3;
				SET_BIT(af.bitvector, AFF_POISON);
				affect_join(victim, &af);
			}

			if (poison != nullptr)
			{
				poison->level = std::max(0, poison->level - 2);
				poison->duration = std::max(0, poison->duration - 1);

				if (poison->level == 0 || poison->duration == 0)
					act("The poison on $p has worn off.", ch, wield, nullptr, TO_CHAR);
			}
		}
	}

	return result;
}